

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_FontFaceQuartet * __thiscall
ON_FontList::QuartetFromQuartetName
          (ON_FontFaceQuartet *__return_storage_ptr__,ON_FontList *this,wchar_t *quartet_name)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  ON_FontFaceQuartet *pOVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ON_ClassArray<ON_FontFaceQuartet> *pOVar8;
  wchar_t *pwVar9;
  wchar_t *string2;
  char cVar10;
  long lVar11;
  ON_wString *src;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ON_FontFaceQuartet *src_00;
  ON_wString locName;
  ON_FontFaceQuartet qname;
  ON_wString OStack_a8;
  ON_ClassArray<ON_FontFaceQuartet> *local_a0;
  ON_wString local_98;
  uint local_90;
  int local_8c;
  ON_FontFaceQuartet *local_88;
  ON_FontFaceQuartet local_80;
  ON_FontFaceQuartet local_58;
  
  ON_FontFaceQuartet::ON_FontFaceQuartet
            (&local_58,quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
  ON_wString::ON_wString(&local_80.m_quartet_name,&local_58.m_quartet_name);
  local_88 = __return_storage_ptr__;
  bVar5 = ON_wString::IsEmpty(&local_80.m_quartet_name);
  ON_wString::~ON_wString(&local_80.m_quartet_name);
  cVar10 = '\x02';
  if (!bVar5) {
    pOVar8 = QuartetList(this);
    iVar7 = pOVar8->m_count;
    uVar6 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                      (pOVar8,&local_58,ON_FontFaceQuartet::CompareQuartetName);
    local_a0 = pOVar8;
    if ((int)uVar6 < 0 || iVar7 <= (int)uVar6) {
      local_90 = uVar6;
      local_8c = iVar7;
      ON_wString::ON_wString(&local_98,quartet_name);
      ON_ManagedFonts::InstalledFonts();
      if (0 < ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count) {
        lVar14 = 0;
        do {
          pOVar1 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_a[lVar14];
          if (pOVar1 == (ON_Font *)0x0) {
            bVar5 = false;
          }
          else {
            ON_wString::ON_wString(&local_80.m_quartet_name,&pOVar1->m_en_windows_logfont_name);
            pwVar9 = ON_wString::operator_cast_to_wchar_t_(&local_98);
            string2 = ON_wString::operator_cast_to_wchar_t_(&local_80.m_quartet_name);
            iVar7 = ON_wString::CompareOrdinal(pwVar9,string2,true);
            bVar5 = false;
            if (iVar7 == 0) {
              bVar5 = ON_wString::IsNotEmpty(&pOVar1->m_loc_windows_logfont_name);
              src = &pOVar1->m_loc_windows_logfont_name;
              if (!bVar5) {
                src = &pOVar1->m_en_windows_logfont_name;
              }
              bVar5 = true;
              ON_wString::ON_wString(&OStack_a8,src);
            }
            ON_wString::~ON_wString(&local_80.m_quartet_name);
          }
          if (bVar5) goto LAB_0048005f;
          lVar14 = lVar14 + 1;
        } while (lVar14 < ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count);
      }
      ON_wString::ON_wString(&OStack_a8,&ON_wString::EmptyString);
LAB_0048005f:
      ON_wString::~ON_wString(&local_98);
      bVar5 = ON_wString::IsEmpty(&OStack_a8);
      iVar7 = local_8c;
      if (bVar5) {
        cVar10 = '\x02';
        bVar5 = false;
        uVar6 = local_90;
      }
      else {
        pwVar9 = ON_wString::operator_cast_to_wchar_t_(&OStack_a8);
        pOVar8 = local_a0;
        ON_FontFaceQuartet::ON_FontFaceQuartet
                  (&local_80,pwVar9,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
        ON_wString::operator=(&local_58.m_quartet_name,&local_80.m_quartet_name);
        local_58.m_italic = local_80.m_italic;
        local_58.m_bold_italic = local_80.m_bold_italic;
        local_58.m_regular = local_80.m_regular;
        local_58.m_bold = local_80.m_bold;
        ON_wString::~ON_wString(&local_80.m_quartet_name);
        uVar6 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                          (pOVar8,&local_58,ON_FontFaceQuartet::CompareQuartetName);
        bVar5 = (int)uVar6 < iVar7 && -1 < (int)uVar6;
        cVar10 = ((int)uVar6 >= iVar7 || -1 >= (int)uVar6) * '\x02';
      }
      ON_wString::~ON_wString(&OStack_a8);
      if (!bVar5) goto LAB_004801a2;
    }
    lVar11 = (long)(int)uVar6;
    uVar12 = uVar6 + 1;
    lVar14 = lVar11 * 0x28;
    do {
      uVar13 = (int)uVar6 >> 0x1f & uVar6;
      if (lVar11 < 1) break;
      iVar7 = ON_FontFaceQuartet::CompareQuartetName
                        (&local_58,
                         (ON_FontFaceQuartet *)
                         ((long)&local_a0->m_a[-1].m_quartet_name.m_s + lVar14));
      uVar12 = uVar12 - 1;
      lVar11 = lVar11 + -1;
      uVar13 = uVar12;
      lVar14 = lVar14 + -0x28;
    } while (iVar7 == 0);
    pOVar4 = local_88;
    src_00 = local_a0->m_a + (int)uVar13;
    ON_wString::ON_wString(&local_88->m_quartet_name,&src_00->m_quartet_name);
    pOVar1 = src_00->m_regular;
    pOVar2 = src_00->m_bold;
    pOVar3 = src_00->m_bold_italic;
    pOVar4->m_italic = src_00->m_italic;
    pOVar4->m_bold_italic = pOVar3;
    pOVar4->m_regular = pOVar1;
    pOVar4->m_bold = pOVar2;
    cVar10 = '\x01';
  }
LAB_004801a2:
  ON_wString::~ON_wString(&local_58.m_quartet_name);
  pOVar4 = local_88;
  if (cVar10 == '\x02') {
    ON_wString::ON_wString(&local_88->m_quartet_name,&ON_FontFaceQuartet::Empty.m_quartet_name);
    pOVar3 = ON_FontFaceQuartet::Empty.m_bold_italic;
    pOVar2 = ON_FontFaceQuartet::Empty.m_bold;
    pOVar1 = ON_FontFaceQuartet::Empty.m_regular;
    pOVar4->m_italic = ON_FontFaceQuartet::Empty.m_italic;
    pOVar4->m_bold_italic = pOVar3;
    pOVar4->m_regular = pOVar1;
    pOVar4->m_bold = pOVar2;
  }
  return pOVar4;
}

Assistant:

const ON_FontFaceQuartet ON_FontList::QuartetFromQuartetName(
  const wchar_t* quartet_name
) const
{
  for (;;)
  {
    ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
    if (qname.QuartetName().IsEmpty())
      break;

    const ON_ClassArray<ON_FontFaceQuartet>& quartet_list = ON_FontList::QuartetList();
    const int quartet_list_count = quartet_list.Count();
    int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);

    bool failedOnFirstTry = i < 0 || i >= quartet_list_count;
    if (failedOnFirstTry)
    {
      //  ... then find the localized name and try again.
      // The QuartetNames in the QuartetList above are localized but sometimes the quartet_name passed to
      // this function is in english. In many cases the localized name and the english name are the same
      // so there is no problem. It is a problem for Japanese and Chinese languages for example. RH-64285
      ON_wString locName = ON_FontList__EnNameToLocName(quartet_name);
      if (locName.IsEmpty())
      {
        break;
      }
      qname = ON_FontFaceQuartet(locName, nullptr, nullptr, nullptr, nullptr);
      i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
      if (i < 0 || i >= quartet_list_count)
      {
        break;
      }
    }

    while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
      i--;
    return quartet_list[i];
  }
  return ON_FontFaceQuartet::Empty;
}